

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# teglSyncTests.cpp
# Opt level: O0

IterateResult __thiscall
deqp::egl::anon_unknown_0::CreateInvalidContextTest::iterate(CreateInvalidContextTest *this)

{
  deUint32 err;
  deBool dVar1;
  MessageBuilder *pMVar2;
  EGLSyncKHR pvVar3;
  TestError *this_00;
  Enum<int,_2UL> EVar4;
  Enum<int,_2UL> local_658;
  MessageBuilder local_648;
  MessageBuilder local_4c8;
  int local_344;
  char *pcStack_340;
  EGLint error;
  MessageBuilder local_338;
  MessageBuilder local_1a8;
  TestLog *local_28;
  TestLog *log;
  Library *egl;
  CreateInvalidContextTest *this_local;
  
  egl = (Library *)this;
  log = (TestLog *)EglTestContext::getLibrary((this->super_SyncTest).super_TestCase.m_eglTestCtx);
  local_28 = tcu::TestContext::getLog
                       ((this->super_SyncTest).super_TestCase.super_TestCase.super_TestNode.
                        m_testCtx);
  tcu::TestLog::operator<<(&local_1a8,local_28,(BeginMessageToken *)&tcu::TestLog::Message);
  pMVar2 = tcu::MessageBuilder::operator<<(&local_1a8,(char (*) [16])0x2b3cc65);
  pMVar2 = tcu::MessageBuilder::operator<<(pMVar2,&(this->super_SyncTest).m_eglDisplay);
  pMVar2 = tcu::MessageBuilder::operator<<(pMVar2,(char (*) [50])0x2b3f4cc);
  tcu::MessageBuilder::operator<<(pMVar2,(EndMessageToken *)&tcu::TestLog::EndMessage);
  tcu::MessageBuilder::~MessageBuilder(&local_1a8);
  do {
    (**(code **)&log->m_log[7].isSessionOpen)(log,(this->super_SyncTest).m_eglDisplay,0,0);
    err = (*(code *)log->m_log[6].lock)();
    eglu::checkError(err,"makeCurrent(m_eglDisplay, EGL_NO_SURFACE, EGL_NO_SURFACE, EGL_NO_CONTEXT)"
                     ,
                     "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/egl/teglSyncTests.cpp"
                     ,0x1b0);
    dVar1 = ::deGetFalse();
  } while (dVar1 != 0);
  pvVar3 = (EGLSyncKHR)
           (*(code *)log->m_log[3].outputFile)
                     (log,(this->super_SyncTest).m_eglDisplay,(this->super_SyncTest).m_syncType,0);
  (this->super_SyncTest).m_sync = pvVar3;
  tcu::TestLog::operator<<(&local_338,local_28,(BeginMessageToken *)&tcu::TestLog::Message);
  pMVar2 = tcu::MessageBuilder::operator<<(&local_338,&(this->super_SyncTest).m_sync);
  pMVar2 = tcu::MessageBuilder::operator<<(pMVar2,(char (*) [21])" = eglCreateSyncKHR(");
  pMVar2 = tcu::MessageBuilder::operator<<(pMVar2,&(this->super_SyncTest).m_eglDisplay);
  pMVar2 = tcu::MessageBuilder::operator<<(pMVar2,(char (*) [3])0x2a3caab);
  pcStack_340 = getSyncTypeName((this->super_SyncTest).m_syncType);
  pMVar2 = tcu::MessageBuilder::operator<<(pMVar2,&stack0xfffffffffffffcc0);
  pMVar2 = tcu::MessageBuilder::operator<<(pMVar2,(char (*) [8])0x2c57cb5);
  tcu::MessageBuilder::operator<<(pMVar2,(EndMessageToken *)&tcu::TestLog::EndMessage);
  tcu::MessageBuilder::~MessageBuilder(&local_338);
  local_344 = (*(code *)log->m_log[6].lock)();
  tcu::TestLog::operator<<(&local_4c8,local_28,(BeginMessageToken *)&tcu::TestLog::Message);
  pMVar2 = tcu::MessageBuilder::operator<<(&local_4c8,&local_344);
  pMVar2 = tcu::MessageBuilder::operator<<(pMVar2,(char (*) [17])" = eglGetError()");
  tcu::MessageBuilder::operator<<(pMVar2,(EndMessageToken *)&tcu::TestLog::EndMessage);
  tcu::MessageBuilder::~MessageBuilder(&local_4c8);
  if (local_344 == 0x3009) {
    do {
      dVar1 = ::deGetFalse();
      if ((dVar1 != 0) || ((this->super_SyncTest).m_sync != (EGLSyncKHR)0x0)) {
        this_00 = (TestError *)__cxa_allocate_exception(0x38);
        tcu::TestError::TestError
                  (this_00,(char *)0x0,"m_sync == EGL_NO_SYNC_KHR",
                   "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/egl/teglSyncTests.cpp"
                   ,0x1bf);
        __cxa_throw(this_00,&tcu::TestError::typeinfo,tcu::TestError::~TestError);
      }
      dVar1 = ::deGetFalse();
    } while (dVar1 != 0);
    tcu::TestContext::setTestResult
              ((this->super_SyncTest).super_TestCase.super_TestCase.super_TestNode.m_testCtx,
               QP_TEST_RESULT_PASS,"Pass");
  }
  else {
    tcu::TestLog::operator<<(&local_648,local_28,(BeginMessageToken *)&tcu::TestLog::Message);
    pMVar2 = tcu::MessageBuilder::operator<<(&local_648,(char (*) [19])"Unexpected error \'");
    EVar4 = eglu::getErrorStr(local_344);
    local_658.m_getName = EVar4.m_getName;
    local_658.m_value = EVar4.m_value;
    pMVar2 = tcu::MessageBuilder::operator<<(pMVar2,&local_658);
    pMVar2 = tcu::MessageBuilder::operator<<(pMVar2,(char (*) [25])"\' expected EGL_BAD_MATCH");
    tcu::MessageBuilder::operator<<(pMVar2,(EndMessageToken *)&tcu::TestLog::EndMessage);
    tcu::MessageBuilder::~MessageBuilder(&local_648);
    tcu::TestContext::setTestResult
              ((this->super_SyncTest).super_TestCase.super_TestCase.super_TestNode.m_testCtx,
               QP_TEST_RESULT_FAIL,"Fail");
  }
  return STOP;
}

Assistant:

IterateResult	iterate						(void)
	{
		const Library&	egl		= m_eglTestCtx.getLibrary();
		TestLog&		log		= m_testCtx.getLog();

		log << TestLog::Message << "eglMakeCurrent(" << m_eglDisplay << ", EGL_NO_SURFACE, EGL_NO_SURFACE, EGL_NO_CONTEXT)" << TestLog::EndMessage;
		EGLU_CHECK_CALL(egl, makeCurrent(m_eglDisplay, EGL_NO_SURFACE, EGL_NO_SURFACE, EGL_NO_CONTEXT));

		m_sync = egl.createSyncKHR(m_eglDisplay, m_syncType, NULL);
		log << TestLog::Message << m_sync << " = eglCreateSyncKHR(" << m_eglDisplay << ", " << getSyncTypeName(m_syncType) << ", NULL)" << TestLog::EndMessage;

		EGLint error = egl.getError();
		log << TestLog::Message << error << " = eglGetError()" << TestLog::EndMessage;

		if (error != EGL_BAD_MATCH)
		{
			log << TestLog::Message << "Unexpected error '" << eglu::getErrorStr(error) << "' expected EGL_BAD_MATCH" << TestLog::EndMessage;
			m_testCtx.setTestResult(QP_TEST_RESULT_FAIL, "Fail");
			return STOP;
		}

		TCU_CHECK(m_sync == EGL_NO_SYNC_KHR);

		m_testCtx.setTestResult(QP_TEST_RESULT_PASS, "Pass");
		return STOP;
	}